

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_4fPoint * __thiscall ON_4fPoint::operator/=(ON_4fPoint *this,float d)

{
  float fVar1;
  
  fVar1 = 1.0 / d;
  this->x = this->x * fVar1;
  this->y = this->y * fVar1;
  this->z = this->z * fVar1;
  this->w = fVar1 * this->w;
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator/=(float d)
{
  const float one_over_d = 1.0f/d;
  x *= one_over_d;
  y *= one_over_d;
  z *= one_over_d;
  w *= one_over_d;
  return *this;
}